

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_done(connectdata *conn,CURLcode status,_Bool premature)

{
  undefined8 *puVar1;
  FILEPROTO *file;
  _Bool premature_local;
  CURLcode status_local;
  connectdata *conn_local;
  
  puVar1 = (undefined8 *)(conn->data->req).protop;
  if (puVar1 != (undefined8 *)0x0) {
    if (puVar1[1] != 0) {
      (*Curl_cfree)((void *)puVar1[1]);
      puVar1[1] = 0;
    }
    *puVar1 = 0;
    if (*(int *)(puVar1 + 2) != -1) {
      close(*(int *)(puVar1 + 2));
    }
    *(undefined4 *)(puVar1 + 2) = 0xffffffff;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode file_done(struct connectdata *conn,
                               CURLcode status, bool premature)
{
  struct FILEPROTO *file = conn->data->req.protop;
  (void)status; /* not used */
  (void)premature; /* not used */

  if(file) {
    Curl_safefree(file->freepath);
    file->path = NULL;
    if(file->fd != -1)
      close(file->fd);
    file->fd = -1;
  }

  return CURLE_OK;
}